

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,inf_or_nan_writer *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  wchar_t __tmp;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  basic_buffer<wchar_t> *c;
  
  uVar10 = (ulong)spec->width_;
  uVar9 = 4 - (ulong)(f->sign == '\0');
  puVar2 = *(undefined8 **)this;
  lVar8 = puVar2[2];
  uVar5 = uVar10 - uVar9;
  if (uVar10 < uVar9 || uVar5 == 0) {
    uVar9 = uVar9 + lVar8;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    piVar6 = (int *)(lVar8 * 4 + puVar2[1]);
    if (f->sign != '\0') {
      *piVar6 = (int)f->sign;
      piVar6 = piVar6 + 1;
    }
    pcVar4 = f->str;
    uVar5 = 4;
    lVar8 = 0;
    do {
      piVar6[lVar8] = (int)pcVar4[lVar8];
      uVar5 = uVar5 - 1;
      lVar8 = lVar8 + 1;
    } while (1 < uVar5);
  }
  else {
    if ((ulong)puVar2[3] < uVar10 + lVar8) {
      (**(code **)*puVar2)();
    }
    puVar2[2] = uVar10 + lVar8;
    piVar6 = (int *)(lVar8 * 4 + puVar2[1]);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar3 = uVar5 >> 1;
      piVar7 = piVar6;
      if (1 < uVar5) {
        piVar7 = piVar6 + uVar3;
        lVar8 = 0;
        do {
          *(wchar_t *)((long)piVar6 + lVar8) = wVar1;
          lVar8 = lVar8 + 4;
        } while (uVar3 * 4 - lVar8 != 0);
      }
      if (f->sign != '\0') {
        *piVar7 = (int)f->sign;
        piVar7 = piVar7 + 1;
      }
      pcVar4 = f->str;
      uVar5 = 4;
      do {
        *piVar7 = (int)*pcVar4;
        pcVar4 = pcVar4 + 1;
        piVar7 = piVar7 + 1;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      if (uVar10 != uVar9) {
        lVar8 = 0;
        do {
          *(wchar_t *)((long)piVar7 + lVar8) = wVar1;
          lVar8 = lVar8 + 4;
        } while (uVar10 * 4 + uVar9 * -4 + uVar3 * -4 != lVar8);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      piVar7 = piVar6;
      if (uVar10 != uVar9) {
        piVar7 = piVar6 + uVar5;
        lVar8 = 0;
        do {
          *(wchar_t *)((long)piVar6 + lVar8) = wVar1;
          lVar8 = lVar8 + 4;
        } while (uVar10 * 4 + uVar9 * -4 != lVar8);
      }
      if (f->sign != '\0') {
        *piVar7 = (int)f->sign;
        piVar7 = piVar7 + 1;
      }
      pcVar4 = f->str;
      uVar5 = 4;
      lVar8 = 0;
      do {
        piVar7[lVar8] = (int)pcVar4[lVar8];
        uVar5 = uVar5 - 1;
        lVar8 = lVar8 + 1;
      } while (1 < uVar5);
    }
    else {
      if (f->sign != '\0') {
        *piVar6 = (int)f->sign;
        piVar6 = piVar6 + 1;
      }
      pcVar4 = f->str;
      uVar5 = 4;
      do {
        *piVar6 = (int)*pcVar4;
        pcVar4 = pcVar4 + 1;
        piVar6 = piVar6 + 1;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      if (uVar10 != uVar9) {
        lVar8 = 0;
        do {
          *(wchar_t *)((long)piVar6 + lVar8) = wVar1;
          lVar8 = lVar8 + 4;
        } while (uVar10 * 4 + uVar9 * -4 != lVar8);
      }
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }